

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

u_char * ngx_strcasestrn(u_char *s1,char *s2,size_t n)

{
  char cVar1;
  ulong uVar2;
  ngx_int_t nVar3;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  
  cVar1 = *s2;
  uVar5 = (long)cVar1 | 0x20;
  if (0x19 < (byte)(cVar1 + 0xbfU)) {
    uVar5 = (long)cVar1;
  }
  do {
    pbVar6 = s1;
    uVar2 = (ulong)*pbVar6;
    if (uVar2 == 0) {
      return (u_char *)0x0;
    }
    s1 = pbVar6 + 1;
    uVar4 = uVar2 | 0x20;
    if (0x19 < (byte)(*pbVar6 + 0xbf)) {
      uVar4 = uVar2;
    }
  } while ((uVar4 != uVar5) || (nVar3 = ngx_strncasecmp(s1,(u_char *)(s2 + 1),n), nVar3 != 0));
  return pbVar6;
}

Assistant:

u_char *
ngx_strcasestrn(u_char *s1, char *s2, size_t n)
{
    ngx_uint_t  c1, c2;

    c2 = (ngx_uint_t) *s2++;
    c2 = (c2 >= 'A' && c2 <= 'Z') ? (c2 | 0x20) : c2;

    do {
        do {
            c1 = (ngx_uint_t) *s1++;

            if (c1 == 0) {
                return NULL;
            }

            c1 = (c1 >= 'A' && c1 <= 'Z') ? (c1 | 0x20) : c1;

        } while (c1 != c2);

    } while (ngx_strncasecmp(s1, (u_char *) s2, n) != 0);

    return --s1;
}